

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

lexeme_t<cfgfile::qstring_trait_t> * __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  char_t c1;
  pos_t pVar2;
  string *str;
  undefined8 uVar3;
  lexical_analyzer_t<cfgfile::qstring_trait_t> *in_RSI;
  lexeme_t<cfgfile::qstring_trait_t> *in_RDI;
  char_t next_char;
  char_t new_char;
  char_t ch;
  bool skip_comment;
  bool first_symbol;
  bool quoted_lexeme;
  string_t result;
  qstring_wrapper_t *in_stack_fffffffffffff968;
  lexeme_type_t type;
  lexeme_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffff970;
  QChar QVar4;
  input_stream_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffff978;
  string_t *what;
  exception_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffff980;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  allocator<char> *in_stack_fffffffffffff9a0;
  allocator<char> *__a;
  string *in_stack_fffffffffffff9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string_t local_569 [2];
  qsizetype local_529;
  char_t *in_stack_fffffffffffffae0;
  lexical_analyzer_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffae8;
  allocator<char> local_419 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c1 [9];
  char16_t local_290;
  char16_t local_28e;
  char16_t local_28c;
  char16_t local_28a;
  char16_t local_288;
  char16_t local_286;
  char16_t local_284;
  char16_t local_282;
  char16_t local_280;
  char16_t local_27e;
  char16_t local_27c;
  char16_t local_27a;
  char16_t local_25a;
  char16_t local_258;
  char16_t local_256;
  char16_t local_254;
  char16_t local_252;
  char16_t local_236;
  char16_t local_234;
  undefined1 local_232;
  undefined2 local_15a;
  undefined2 local_6e;
  char16_t local_6c;
  undefined2 local_6a;
  char16_t local_68;
  char16_t local_66;
  char16_t local_64;
  char16_t local_62;
  char16_t local_60;
  QChar local_5e;
  undefined4 local_5c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  qstring_wrapper_t::qstring_wrapper_t((qstring_wrapper_t *)0x155a57);
  local_29 = 0;
  local_2a = 1;
  local_2b = 0;
  skip_spaces((lexical_analyzer_t<cfgfile::qstring_trait_t> *)in_stack_fffffffffffff970);
  pVar2 = input_stream_t<cfgfile::qstring_trait_t>::line_number(in_RSI->m_stream);
  in_RSI->m_line_number = pVar2;
  pVar2 = input_stream_t<cfgfile::qstring_trait_t>::column_number(in_RSI->m_stream);
  in_RSI->m_column_number = pVar2;
  bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end(in_stack_fffffffffffff978);
  if (bVar1) {
    qstring_wrapper_t::qstring_wrapper_t((qstring_wrapper_t *)0x155ae2);
    lexeme_t<cfgfile::qstring_trait_t>::lexeme_t
              (in_stack_fffffffffffff970,(lexeme_type_t)((ulong)in_stack_fffffffffffff968 >> 0x20),
               (string_t *)0x155afb);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x155b0a);
    goto LAB_001572d2;
  }
LAB_00155b5b:
  local_60 = (char16_t)input_stream_t<cfgfile::qstring_trait_t>::get(in_stack_fffffffffffff978);
  local_62 = const_t<cfgfile::qstring_trait_t>::c_quotes.ucs;
  local_5e.ucs = local_60;
  bVar1 = ::operator==((QChar)local_60,const_t<cfgfile::qstring_trait_t>::c_quotes);
  if (bVar1) {
    if ((local_29 & 1) != 0) goto LAB_001572ab;
    if ((local_2a & 1) == 0) {
      local_64 = local_5e.ucs;
      input_stream_t<cfgfile::qstring_trait_t>::put_back
                (in_stack_fffffffffffff978,
                 (char_t)(char16_t)((ulong)in_stack_fffffffffffff980 >> 0x30));
      goto LAB_001572ab;
    }
    local_29 = 1;
  }
  else {
    local_66 = local_5e.ucs;
    local_68 = const_t<cfgfile::qstring_trait_t>::c_back_slash.ucs;
    bVar1 = ::operator==(local_5e,const_t<cfgfile::qstring_trait_t>::c_back_slash);
    if (bVar1) {
      QChar::QChar((QChar *)in_stack_fffffffffffff970,
                   (int)((ulong)in_stack_fffffffffffff968 >> 0x20));
      if ((local_29 & 1) == 0) {
        local_6c = local_5e.ucs;
        qstring_wrapper_t::push_back
                  (in_stack_fffffffffffff968,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30));
      }
      else {
        bVar1 = process_back_slash(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
        if (!bVar1) {
          local_232 = 1;
          uVar3 = __cxa_allocate_exception(0x28);
          QVar4.ucs = (char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,
                     in_stack_fffffffffffff9a0);
          qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
          local_15a = local_6a;
          qstring_wrapper_t::qstring_wrapper_t(in_stack_fffffffffffff968,0,QVar4);
          operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                    (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,
                     in_stack_fffffffffffff9a0);
          qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
          operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                    (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
          input_stream_t<cfgfile::qstring_trait_t>::file_name(in_RSI->m_stream);
          operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                    (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,
                     in_stack_fffffffffffff9a0);
          qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
          operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                    (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
          line_number(in_RSI);
          qstring_trait_t::to_string((pos_t)in_stack_fffffffffffff9a8);
          operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                    (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,
                     in_stack_fffffffffffff9a0);
          qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
          operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                    (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
          exception_t<cfgfile::qstring_trait_t>::exception_t
                    (in_stack_fffffffffffff980,(string_t *)in_stack_fffffffffffff978);
          local_232 = 0;
          __cxa_throw(uVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
        local_6e = local_6a;
        qstring_wrapper_t::push_back
                  (in_stack_fffffffffffff968,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30));
      }
    }
    else {
      local_234 = local_5e.ucs;
      local_236 = const_t<cfgfile::qstring_trait_t>::c_begin_tag.ucs;
      bVar1 = ::operator==(local_5e,const_t<cfgfile::qstring_trait_t>::c_begin_tag);
      if (bVar1) {
        bVar1 = qstring_wrapper_t::empty((qstring_wrapper_t *)0x1562a1);
        QVar4.ucs = (char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30);
        if (bVar1) {
          local_252 = local_5e.ucs;
          qstring_wrapper_t::qstring_wrapper_t(in_stack_fffffffffffff968,0,QVar4);
          lexeme_t<cfgfile::qstring_trait_t>::lexeme_t
                    (in_stack_fffffffffffff970,
                     (lexeme_type_t)((ulong)in_stack_fffffffffffff968 >> 0x20),(string_t *)0x1562f0)
          ;
          qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x1562ff);
          goto LAB_001572d2;
        }
        if ((local_29 & 1) == 0) {
          local_256 = local_5e.ucs;
          input_stream_t<cfgfile::qstring_trait_t>::put_back
                    (in_stack_fffffffffffff978,
                     (char_t)(char16_t)((ulong)in_stack_fffffffffffff980 >> 0x30));
          goto LAB_001572ab;
        }
        local_254 = local_5e.ucs;
        qstring_wrapper_t::push_back(in_stack_fffffffffffff968,QVar4);
      }
      else {
        local_258 = local_5e.ucs;
        local_25a = const_t<cfgfile::qstring_trait_t>::c_end_tag.ucs;
        bVar1 = ::operator==(local_5e,const_t<cfgfile::qstring_trait_t>::c_end_tag);
        if (bVar1) {
          bVar1 = qstring_wrapper_t::empty((qstring_wrapper_t *)0x1563ee);
          QVar4.ucs = (char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30);
          if (bVar1) {
            local_27a = local_5e.ucs;
            qstring_wrapper_t::qstring_wrapper_t(in_stack_fffffffffffff968,0,QVar4);
            lexeme_t<cfgfile::qstring_trait_t>::lexeme_t
                      (in_stack_fffffffffffff970,
                       (lexeme_type_t)((ulong)in_stack_fffffffffffff968 >> 0x20),
                       (string_t *)0x15643d);
            qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x15644c);
            goto LAB_001572d2;
          }
          if ((local_29 & 1) == 0) {
            local_27e = local_5e.ucs;
            input_stream_t<cfgfile::qstring_trait_t>::put_back
                      (in_stack_fffffffffffff978,
                       (char_t)(char16_t)((ulong)in_stack_fffffffffffff980 >> 0x30));
            goto LAB_001572ab;
          }
          local_27c = local_5e.ucs;
          qstring_wrapper_t::push_back(in_stack_fffffffffffff968,QVar4);
        }
        else {
          local_280 = local_5e.ucs;
          local_282 = const_t<cfgfile::qstring_trait_t>::c_space.ucs;
          bVar1 = ::operator==(local_5e,const_t<cfgfile::qstring_trait_t>::c_space);
          if (!bVar1) {
            local_284 = local_5e.ucs;
            local_286 = const_t<cfgfile::qstring_trait_t>::c_tab.ucs;
            bVar1 = ::operator==(local_5e,const_t<cfgfile::qstring_trait_t>::c_tab);
            if (!bVar1) {
              local_28a = local_5e.ucs;
              local_28c = const_t<cfgfile::qstring_trait_t>::c_carriage_return.ucs;
              bVar1 = ::operator==(local_5e,const_t<cfgfile::qstring_trait_t>::c_carriage_return);
              if (bVar1) {
LAB_00156627:
                if ((local_29 & 1) != 0) {
                  uVar3 = __cxa_allocate_exception(0x28);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,
                             in_stack_fffffffffffff9a0);
                  qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,
                             in_stack_fffffffffffff9a0);
                  qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
                  operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                            (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
                  input_stream_t<cfgfile::qstring_trait_t>::file_name(in_RSI->m_stream);
                  operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                            (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
                  this_01 = local_3c1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (this_01,(char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                  qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
                  operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
                            (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
                  str = (string *)line_number(in_RSI);
                  qstring_trait_t::to_string((pos_t)str);
                  operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)in_stack_fffffffffffff9a0)
                  ;
                  __a = local_419;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,__a);
                  qstring_trait_t::from_ascii(str);
                  operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
                  exception_t<cfgfile::qstring_trait_t>::exception_t
                            (in_stack_fffffffffffff980,(string_t *)in_stack_fffffffffffff978);
                  __cxa_throw(uVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                              exception_t<cfgfile::qstring_trait_t>::~exception_t);
                }
                goto LAB_001572ab;
              }
              local_28e = local_5e.ucs;
              local_290 = const_t<cfgfile::qstring_trait_t>::c_line_feed.ucs;
              bVar1 = ::operator==(local_5e,const_t<cfgfile::qstring_trait_t>::c_line_feed);
              if (bVar1) goto LAB_00156627;
              bVar1 = ::operator==(local_5e,const_t<cfgfile::qstring_trait_t>::c_vertical_bar);
              QVar4.ucs = (char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30);
              if (!bVar1) {
                qstring_wrapper_t::push_back(in_stack_fffffffffffff968,QVar4);
                goto LAB_00156d45;
              }
              if ((local_29 & 1) == 0) {
                bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end(in_stack_fffffffffffff978);
                if (bVar1) {
                  qstring_wrapper_t::push_back
                            (in_stack_fffffffffffff968,
                             (QChar)(char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30));
                }
                else {
                  c1 = input_stream_t<cfgfile::qstring_trait_t>::get(in_stack_fffffffffffff978);
                  bVar1 = ::operator==((QChar)c1.ucs,
                                       const_t<cfgfile::qstring_trait_t>::c_vertical_bar);
                  if (bVar1) {
                    local_2b = 1;
                    skip_one_line_comment
                              ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)
                               in_stack_fffffffffffff980);
                    if ((local_2a & 1) == 0) goto LAB_001572ab;
                    skip_spaces((lexical_analyzer_t<cfgfile::qstring_trait_t> *)
                                in_stack_fffffffffffff970);
                  }
                  else {
                    bVar1 = ::operator==((QChar)c1.ucs,const_t<cfgfile::qstring_trait_t>::c_sharp);
                    if (bVar1) {
                      local_2b = 1;
                      skip_multi_line_comment
                                ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)
                                 in_stack_fffffffffffff980);
                      if ((local_2a & 1) == 0) goto LAB_001572ab;
                      skip_spaces((lexical_analyzer_t<cfgfile::qstring_trait_t> *)
                                  in_stack_fffffffffffff970);
                    }
                    else {
                      qstring_wrapper_t::push_back
                                (in_stack_fffffffffffff968,
                                 (QChar)(char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30));
                      input_stream_t<cfgfile::qstring_trait_t>::put_back
                                (in_stack_fffffffffffff978,
                                 (char_t)(char16_t)((ulong)in_stack_fffffffffffff980 >> 0x30));
                    }
                  }
                }
              }
              else {
                qstring_wrapper_t::push_back(in_stack_fffffffffffff968,QVar4);
              }
              goto LAB_00156d45;
            }
          }
          if ((local_29 & 1) == 0) goto LAB_001572ab;
          local_288 = local_5e.ucs;
          qstring_wrapper_t::push_back
                    (in_stack_fffffffffffff968,
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffff970 >> 0x30));
        }
      }
    }
  }
LAB_00156d45:
  bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end(in_stack_fffffffffffff978);
  if (!bVar1) {
    if ((local_2b & 1) == 0) {
      local_2a = 0;
    }
    else {
      local_2b = 0;
    }
    goto LAB_00155b5b;
  }
  if ((local_29 & 1) != 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
    this_00 = (exception_t<cfgfile::qstring_trait_t> *)&local_569[2].m_str.d.size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
              (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
    input_stream_t<cfgfile::qstring_trait_t>::file_name(in_RSI->m_stream);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
              (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
    what = local_569;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
              (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
    line_number(in_RSI);
    qstring_trait_t::to_string((pos_t)in_stack_fffffffffffff9a8);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
              (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffff9a8);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffff9a8,
              (qstring_wrapper_t *)in_stack_fffffffffffff9a0);
    exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,what);
    __cxa_throw(uVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  bVar1 = qstring_wrapper_t::empty((qstring_wrapper_t *)0x15721d);
  type = (lexeme_type_t)((ulong)in_stack_fffffffffffff968 >> 0x20);
  if (bVar1) {
    qstring_wrapper_t::qstring_wrapper_t((qstring_wrapper_t *)0x157230);
    lexeme_t<cfgfile::qstring_trait_t>::lexeme_t
              (in_stack_fffffffffffff970,type,(string_t *)0x157249);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x157258);
  }
  else {
LAB_001572ab:
    lexeme_t<cfgfile::qstring_trait_t>::lexeme_t
              (in_stack_fffffffffffff970,(lexeme_type_t)((ulong)in_stack_fffffffffffff968 >> 0x20),
               (string_t *)0x1572c5);
  }
LAB_001572d2:
  local_5c = 1;
  qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x1572df);
  return in_RDI;
}

Assistant:

lexeme_t< Trait > next_lexeme()
	{
		typename Trait::string_t result;

		bool quoted_lexeme = false;
		bool first_symbol = true;
		bool skip_comment = false;

		skip_spaces();

		m_line_number = m_stream.line_number();
		m_column_number = m_stream.column_number();

		if( m_stream.at_end() )
			return lexeme_t< Trait >( lexeme_type_t::null,
				typename Trait::string_t() );

		while( true )
		{
			typename Trait::char_t ch = m_stream.get();

			if( ch == const_t< Trait >::c_quotes )
			{
				if( quoted_lexeme )
					break;
				else if( first_symbol )
					quoted_lexeme = true;
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_back_slash )
			{
				typename Trait::char_t new_char( 0x00 );

				if( !quoted_lexeme )
					result.push_back( ch );
				else if( process_back_slash( new_char ) )
					result.push_back( new_char );
				else
					throw exception_t< Trait >(
						Trait::from_ascii( "Unrecognized back-slash "
							"sequence: \"\\" ) +
						typename Trait::string_t( 1, new_char ) +
						Trait::from_ascii( "\". In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
			}
			else if( ch == const_t< Trait >::c_begin_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::start,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_end_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::finish,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_space ||
				ch == const_t< Trait >::c_tab )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_carriage_return ||
				ch == const_t< Trait >::c_line_feed )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "New line detected. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_vertical_bar )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					if( !m_stream.at_end() )
					{
						typename Trait::char_t next_char = m_stream.get();

						if( next_char == const_t< Trait >::c_vertical_bar )
						{
							skip_comment = true;

							skip_one_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else if( next_char == const_t< Trait >::c_sharp )
						{
							skip_comment = true;

							skip_multi_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else
						{
							result.push_back( ch );

							m_stream.put_back( next_char );
						}
					}
					else
						result.push_back( ch );
				}
			}
			else
				result.push_back( ch );

			if( m_stream.at_end() )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "End of file riched. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::null,
						typename Trait::string_t() );
				else
					break;
			}

			if( !skip_comment )
				first_symbol = false;
			else
				skip_comment = false;
		}

		return lexeme_t< Trait >( lexeme_type_t::string, result );
	}